

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane3d.h
# Opt level: O0

EIntersectionRelation3D __thiscall
irr::core::plane3d<float>::classifyPointRelation(plane3d<float> *this,vector3d<float> *point)

{
  vector3d<float> *in_RSI;
  vector3d<float> *in_RDI;
  float fVar1;
  float d;
  EIntersectionRelation3D local_4;
  
  fVar1 = vector3d<float>::dotProduct(in_RDI,in_RSI);
  fVar1 = fVar1 + in_RDI[1].X;
  if (-1e-06 <= fVar1) {
    if (fVar1 <= 1e-06) {
      local_4 = ISREL3D_PLANAR;
    }
    else {
      local_4 = ISREL3D_FRONT;
    }
  }
  else {
    local_4 = ISREL3D_BACK;
  }
  return local_4;
}

Assistant:

EIntersectionRelation3D classifyPointRelation(const vector3d<T> &point) const
	{
		const T d = Normal.dotProduct(point) + D;

		if (d < -ROUNDING_ERROR_f32)
			return ISREL3D_BACK;

		if (d > ROUNDING_ERROR_f32)
			return ISREL3D_FRONT;

		return ISREL3D_PLANAR;
	}